

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O1

void Llb_NonlinTrySubsetting(DdManager *dd,DdNode *bFunc)

{
  uint uVar1;
  uint uVar2;
  int numVars;
  DdNode *n;
  
  uVar1 = Cudd_DagSize(bFunc);
  uVar2 = Cudd_SupportSize(dd,bFunc);
  printf("Original = %6d.  SuppSize = %3d.    ",(ulong)uVar1,(ulong)uVar2);
  numVars = Cudd_SupportSize(dd,bFunc);
  n = Cudd_SubsetHeavyBranch(dd,bFunc,numVars,1000);
  Cudd_Ref(n);
  uVar1 = Cudd_DagSize(n);
  uVar2 = Cudd_SupportSize(dd,n);
  printf("Result   = %6d.  SuppSize = %3d.\n",(ulong)uVar1,(ulong)uVar2);
  Cudd_RecursiveDeref(dd,n);
  return;
}

Assistant:

void Llb_NonlinTrySubsetting( DdManager * dd, DdNode * bFunc )
{
    DdNode * bNew;
    printf( "Original = %6d.  SuppSize = %3d.    ", 
        Cudd_DagSize(bFunc), Cudd_SupportSize(dd, bFunc) );
    bNew = Cudd_SubsetHeavyBranch( dd, bFunc, Cudd_SupportSize(dd, bFunc), 1000 );  Cudd_Ref( bNew );
    printf( "Result   = %6d.  SuppSize = %3d.\n", 
        Cudd_DagSize(bNew), Cudd_SupportSize(dd, bNew) );
    Cudd_RecursiveDeref( dd, bNew );
}